

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

void __thiscall argparse::ArgumentParser::~ArgumentParser(ArgumentParser *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  ::~_Rb_tree(&(this->mArgumentMap)._M_t);
  std::__cxx11::_List_base<argparse::Argument,_std::allocator<argparse::Argument>_>::_M_clear
            (&(this->mOptionalArguments).
              super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>);
  std::__cxx11::_List_base<argparse::Argument,_std::allocator<argparse::Argument>_>::_M_clear
            (&(this->mPositionalArguments).
              super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>);
  pcVar1 = (this->mEpilog)._M_dataplus._M_p;
  paVar2 = &(this->mEpilog).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->mDescription)._M_dataplus._M_p;
  paVar2 = &(this->mDescription).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->mVersion)._M_dataplus._M_p;
  paVar2 = &(this->mVersion).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->mProgramName)._M_dataplus._M_p;
  paVar2 = &(this->mProgramName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

explicit ArgumentParser(std::string aProgramName = {},
                                std::string aVersion = "1.0",
                                default_arguments aArgs = default_arguments::all)
                : mProgramName(std::move(aProgramName)), mVersion(std::move(aVersion)) {
            if (aArgs & default_arguments::help) {
                add_argument("-h", "--help")
                        .action([&](const auto &) {
                            std::cout << help().str();
                            std::exit(0);
                        })
                        .default_value(false)
                        .help("shows help message and exits")
                        .implicit_value(true)
                        .nargs(0);
            }
            if (aArgs & default_arguments::version) {
                add_argument("-v", "--version")
                        .action([&](const auto &) {
                            std::cout << mVersion;
                            std::exit(0);
                        })
                        .default_value(false)
                        .help("prints version information and exits")
                        .implicit_value(true)
                        .nargs(0);
            }
        }